

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evenOdd.cpp
# Opt level: O0

int calculateEvenOddDifference(int *array,int size)

{
  int local_20;
  int local_1c;
  int x;
  int oddTotal;
  int evenTotal;
  int size_local;
  int *array_local;
  
  x = 0;
  local_1c = 0;
  for (local_20 = 0; local_20 < size; local_20 = local_20 + 1) {
    if (array[local_20] % 2 == 0) {
      x = array[local_20] + x;
    }
    else {
      local_1c = array[local_20] + local_1c;
    }
  }
  return x - local_1c;
}

Assistant:

int calculateEvenOddDifference(int array[], int size)
{
    int evenTotal = 0;
    int oddTotal = 0;

    for(int x = 0; x < size; x++)
    {

        // if value is even...
        if((array[x] % 2) == 0)
        {
            evenTotal += array[x];
        }
        else
        {
            oddTotal += array[x];
        }
    }
    //easy way to calculate what is asked for
    return evenTotal - oddTotal;
}